

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::PatchScopedGetMethod<false,Js::PolymorphicInlineCache>
              (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,Var instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext;
  PropertyRecord *pPVar5;
  uint uVar6;
  undefined1 local_88 [8];
  PropertyValueInfo info;
  Var value;
  RecyclableObject *object;
  
  object._4_4_ = propertyId;
  if (inlineCache == (PolymorphicInlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x20c1,"(inlineCache != nullptr)","inlineCache != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  value = (Var)0x0;
  BVar3 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&value);
  if (BVar3 == 0) {
    bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext);
    if (bVar2) {
      pPVar5 = ScriptContext::GetPropertyName(scriptContext,object._4_4_);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec48,(PCWSTR)(pPVar5 + 1));
    }
    info._56_8_ = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  else {
    local_88 = (undefined1  [8])0x0;
    info.m_instance = (RecyclableObject *)0x50000ffff;
    info.m_propertyIndex = 0;
    info.m_attributes = '\0';
    info.flags = InlineCacheNoFlags;
    info.cacheInfoFlag = 0;
    info.inlineCache = (InlineCache *)0x0;
    info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
    info.functionBody = (FunctionBody *)0x0;
    info.prop = (RecyclableObject *)0x0;
    info.propertyRecordUsageCache._0_4_ = 0xffffffff;
    info.propertyRecordUsageCache._5_1_ = 1;
    PropertyValueInfo::SetCacheInfo
              ((PropertyValueInfo *)local_88,functionBody,inlineCache,inlineCacheIndex,true);
    uVar6 = **(uint **)((long)value + 8) & 0xfffffffe;
    bVar2 = CacheOperators::TryGetProperty<true,true,true,false,true,false,false,true,false,false>
                      (instance,uVar6 == 0x50,(RecyclableObject *)value,object._4_4_,
                       (Var *)&info.inlineCacheIndex,scriptContext,(PropertyCacheOperationInfo *)0x0
                       ,(PropertyValueInfo *)local_88);
    if (!bVar2) {
      bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
      if ((bVar2) && (DAT_0145948a == '\x01')) {
        CacheOperators::TraceCache
                  (inlineCache,L"PatchGetMethod",object._4_4_,scriptContext,
                   (RecyclableObject *)value);
      }
      info._56_8_ = PatchGetMethodFromObject
                              (instance,(RecyclableObject *)value,object._4_4_,
                               (PropertyValueInfo *)local_88,scriptContext,uVar6 == 0x50);
    }
  }
  return (Var)info._56_8_;
}

Assistant:

inline Var JavascriptOperators::PatchScopedGetMethod(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, Var instance, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_ScopedGetMethod);
        Assert(inlineCache != nullptr);

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        RecyclableObject* object = nullptr;
        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            // Don't error if we disabled implicit calls
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined,
                    scriptContext->GetPropertyName(propertyId)->GetBuffer());
            }
            else
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
        }

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        const bool isRoot = VarIs<RootObjectBase>(object);
        Var value;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
                instance, isRoot, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetMethod"), propertyId, scriptContext, object);
        }
#endif

        return Js::JavascriptOperators::PatchGetMethodFromObject(instance, object, propertyId, &info, scriptContext, isRoot);
        JIT_HELPER_END(Op_ScopedGetMethod);
    }